

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_assign(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue excluded;
  int iVar1;
  int64_t *piVar2;
  long lVar3;
  JSValue JVar4;
  JSValue JVar5;
  JSValueUnion local_50;
  int64_t local_48;
  uint uStack_3c;
  
  JVar4 = JS_ToObject(ctx,*argv);
  if ((int)JVar4.tag == 6) {
    JVar5 = (JSValue)(ZEXT816(3) << 0x40);
LAB_001524e9:
    JS_FreeValue(ctx,JVar4);
    JS_FreeValue(ctx,JVar5);
    local_48 = 6;
    local_50.float64 = 0.0;
  }
  else {
    piVar2 = &argv[1].tag;
    for (lVar3 = 1; lVar3 < argc; lVar3 = lVar3 + 1) {
      if (((uint)*piVar2 & 0xfffffffe) != 2) {
        JVar5.tag = *piVar2;
        JVar5.u.ptr = ((JSValueUnion *)(piVar2 + -1))->ptr;
        JVar5 = JS_ToObject(ctx,JVar5);
        if (((int)JVar5.tag == 6) ||
           (excluded.tag = 3, excluded.u.ptr = (void *)((ulong)uStack_3c << 0x20),
           iVar1 = JS_CopyDataProperties(ctx,JVar4,JVar5,excluded,1), iVar1 != 0))
        goto LAB_001524e9;
        JS_FreeValue(ctx,JVar5);
      }
      piVar2 = piVar2 + 2;
    }
    local_48 = JVar4.tag;
    local_50 = JVar4.u;
  }
  JVar4.tag = local_48;
  JVar4.u.float64 = local_50.float64;
  return JVar4;
}

Assistant:

static JSValue js_object_assign(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    // Object.assign(obj, source1)
    JSValue obj, s;
    int i;

    s = JS_UNDEFINED;
    obj = JS_ToObject(ctx, argv[0]);
    if (JS_IsException(obj))
        goto exception;
    for (i = 1; i < argc; i++) {
        if (!JS_IsNull(argv[i]) && !JS_IsUndefined(argv[i])) {
            s = JS_ToObject(ctx, argv[i]);
            if (JS_IsException(s))
                goto exception;
            if (JS_CopyDataProperties(ctx, obj, s, JS_UNDEFINED, TRUE))
                goto exception;
            JS_FreeValue(ctx, s);
        }
    }
    return obj;
exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, s);
    return JS_EXCEPTION;
}